

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O2

bool __thiscall
sf::priv::ImageLoader::saveImageToFile
          (ImageLoader *this,string *filename,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  uint x;
  uint y;
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  allocator local_69;
  string extension;
  string local_48;
  
  if ((((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish) || (size->x == 0)) || (size->y == 0)) goto LAB_001b6141;
  lVar3 = std::__cxx11::string::rfind((char)filename,0x2e);
  if (lVar3 == -1) {
    std::__cxx11::string::string((string *)&extension,"",&local_69);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)filename);
    anon_unknown.dwarf_2d0aac::toLower(&extension,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  x = size->x;
  y = size->y;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &extension,"bmp");
  if (bVar1) {
    iVar2 = stbi_write_bmp((filename->_M_dataplus)._M_p,x,y,4,
                           (pixels->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
LAB_001b6125:
    if (iVar2 != 0) {
      std::__cxx11::string::~string((string *)&extension);
      return true;
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &extension,"tga");
    if (bVar1) {
      iVar2 = stbi_write_tga((filename->_M_dataplus)._M_p,x,y,4,
                             (pixels->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start);
      goto LAB_001b6125;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &extension,"png");
    if (bVar1) {
      iVar2 = stbi_write_png((filename->_M_dataplus)._M_p,x,y,4,
                             (pixels->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start,0);
      goto LAB_001b6125;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &extension,"jpg");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&extension,"jpeg"), bVar1)) {
      iVar2 = stbi_write_jpg((filename->_M_dataplus)._M_p,x,y,4,
                             (pixels->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start,0x5a);
      goto LAB_001b6125;
    }
  }
  std::__cxx11::string::~string((string *)&extension);
LAB_001b6141:
  poVar4 = err();
  poVar4 = std::operator<<(poVar4,"Failed to save image \"");
  poVar4 = std::operator<<(poVar4,(string *)filename);
  poVar4 = std::operator<<(poVar4,"\"");
  std::endl<char,std::char_traits<char>>(poVar4);
  return false;
}

Assistant:

bool ImageLoader::saveImageToFile(const std::string& filename, const std::vector<Uint8>& pixels, const Vector2u& size)
{
    // Make sure the image is not empty
    if (!pixels.empty() && (size.x > 0) && (size.y > 0))
    {
        // Deduce the image type from its extension

        // Extract the extension
        const std::size_t dot = filename.find_last_of('.');
        const std::string extension = dot != std::string::npos ? toLower(filename.substr(dot + 1)) : "";
        const Vector2i convertedSize = Vector2i(size);

        if (extension == "bmp")
        {
            // BMP format
            if (stbi_write_bmp(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (extension == "tga")
        {
            // TGA format
            if (stbi_write_tga(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (extension == "png")
        {
            // PNG format
            if (stbi_write_png(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0], 0))
                return true;
        }
        else if (extension == "jpg" || extension == "jpeg")
        {
            // JPG format
            if (stbi_write_jpg(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0], 90))
                return true;
        }
    }

    err() << "Failed to save image \"" << filename << "\"" << std::endl;
    return false;
}